

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeI31Get(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1431,"Expression *wasm::TranslateToFuzzReader::makeI31Get(Type)");
  }
  if ((~(this->wasm->features).features & 0x500) == 0) {
    pEVar2 = makeTrappingRefUse(this,(HeapType)0x30);
    uVar1 = Random::upTo(&this->random,2);
    pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar3->_id = I31GetId;
    (pEVar3->type).id = 0;
    *(Expression **)(pEVar3 + 1) = pEVar2;
    *(bool *)&pEVar3[1].type.id = uVar1 == 0;
    ::wasm::I31Get::finalize();
    return pEVar3;
  }
  __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1432,"Expression *wasm::TranslateToFuzzReader::makeI31Get(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeI31Get(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  auto* i31 = makeTrappingRefUse(HeapType::i31);
  return builder.makeI31Get(i31, bool(oneIn(2)));
}